

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O1

void * voc_stk_alo(voccxdef *ctx,uint siz)

{
  uchar *puVar1;
  uchar *puVar2;
  
  puVar1 = ctx->voc_stk_cur;
  puVar2 = puVar1 + (siz + 7 & 0xfffffff8);
  if (puVar2 <= ctx->voc_stk_end) {
    ctx->voc_stk_cur = puVar2;
    return puVar1;
  }
  errsigf(ctx->voccxerr,"TADS",0x417);
}

Assistant:

void *voc_stk_alo(voccxdef *ctx, uint siz)
{
    void *ret;
    
    /* round size up to allocation units */
    siz = osrndsz(siz);

    /* if there's not space, signal an error */
    if (ctx->voc_stk_cur + siz > ctx->voc_stk_end)
        errsig(ctx->voccxerr, ERR_VOCSTK);

    /* save the return pointer */
    ret = ctx->voc_stk_cur;

    /* consume the space */
    ctx->voc_stk_cur += siz;

/*#define SHOW_HI*/
#ifdef SHOW_HI
{
    static uint maxsiz;
    if (ctx->voc_stk_cur - ctx->voc_stk_ptr > maxsiz)
    {
        char buf[20];
        
        maxsiz = ctx->voc_stk_cur - ctx->voc_stk_ptr;
        sprintf(buf, "%u\n", maxsiz);
        os_printz(buf);
    }
}
#endif


    /* return the space */
    return ret;
}